

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalWatcomWMakeGenerator::EnableLanguage
          (cmGlobalWatcomWMakeGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *l,cmMakefile *mf,bool optional)

{
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"WATCOM",&local_41);
  value._M_str = "1";
  value._M_len = 1;
  cmMakefile::AddDefinition(mf,&local_40,value);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_QUOTE_INCLUDE_PATHS",&local_41);
  value_00._M_str = "1";
  value_00._M_len = 1;
  cmMakefile::AddDefinition(mf,&local_40,value_00);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_MANGLE_OBJECT_FILE_NAMES",&local_41);
  value_01._M_str = "1";
  value_01._M_len = 1;
  cmMakefile::AddDefinition(mf,&local_40,value_01);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_MAKE_SYMBOLIC_RULE",&local_41);
  value_02._M_str = ".SYMBOLIC";
  value_02._M_len = 9;
  cmMakefile::AddDefinition(mf,&local_40,value_02);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_GENERATOR_CC",&local_41);
  value_03._M_str = "wcl386";
  value_03._M_len = 6;
  cmMakefile::AddDefinition(mf,&local_40,value_03);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_GENERATOR_CXX",&local_41);
  value_04._M_str = "wcl386";
  value_04._M_len = 6;
  cmMakefile::AddDefinition(mf,&local_40,value_04);
  std::__cxx11::string::~string((string *)&local_40);
  cmGlobalUnixMakefileGenerator3::EnableLanguage
            (&this->super_cmGlobalUnixMakefileGenerator3,l,mf,optional);
  return;
}

Assistant:

void cmGlobalWatcomWMakeGenerator::EnableLanguage(
  std::vector<std::string> const& l, cmMakefile* mf, bool optional)
{
  // pick a default
  mf->AddDefinition("WATCOM", "1");
  mf->AddDefinition("CMAKE_QUOTE_INCLUDE_PATHS", "1");
  mf->AddDefinition("CMAKE_MANGLE_OBJECT_FILE_NAMES", "1");
  mf->AddDefinition("CMAKE_MAKE_SYMBOLIC_RULE", ".SYMBOLIC");
  mf->AddDefinition("CMAKE_GENERATOR_CC", "wcl386");
  mf->AddDefinition("CMAKE_GENERATOR_CXX", "wcl386");
  this->cmGlobalUnixMakefileGenerator3::EnableLanguage(l, mf, optional);
}